

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution::forward
          (Deconvolution *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar5;
  int ret;
  Mat top_blob_bordered;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  int h;
  int w;
  Mat *_bias_data;
  Mat bias_data_flattened;
  int k;
  int j;
  int i;
  float *wg;
  float *wg2;
  int g;
  int maxk;
  int inch_g;
  int outch_g;
  Mat weight_data_transposed;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_h;
  int _kernel_w;
  int _num_input;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  undefined4 in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  Mat *in_stack_fffffffffffffb40;
  int _c;
  undefined8 in_stack_fffffffffffffb48;
  Mat *in_stack_fffffffffffffb50;
  Mat *in_stack_fffffffffffffb58;
  Mat *in_stack_fffffffffffffb60;
  void **ppvVar6;
  Deconvolution *in_stack_fffffffffffffb68;
  bool local_441;
  bool local_3d9;
  bool local_3b9;
  value_type local_398;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  int local_340;
  int local_33c;
  const_reference local_338;
  void *local_330;
  int *local_328;
  size_t local_320;
  int local_318;
  Allocator *local_310;
  int local_308;
  int local_304;
  Mat *in_stack_fffffffffffffd08;
  Mat *weight_data;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  int in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  int local_2c8;
  void *local_2b8;
  int *local_2b0;
  undefined8 local_2a8;
  undefined4 local_2a0;
  long *local_298;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  int local_280;
  long local_278;
  undefined4 local_270;
  void *local_260;
  int *local_258;
  undefined8 local_250;
  undefined4 local_248;
  long *local_240;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 local_22c;
  int local_228;
  long local_220;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  reference local_208;
  const_reference local_200;
  const_reference local_1f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1e8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1e0;
  int local_1cc;
  void **local_1c8;
  void **local_1c0;
  void **local_1b8;
  value_type *local_1b0;
  value_type *local_1a8;
  void **local_198;
  void **local_188;
  void **local_178;
  int local_168;
  undefined4 local_164;
  reference local_160;
  reference local_158;
  reference local_150;
  reference local_148;
  value_type *local_140;
  Mat *local_138;
  void **local_130;
  void **local_128;
  void **local_120;
  void **local_118;
  reference local_108;
  int local_f0;
  undefined4 local_ec;
  void **local_e8;
  int local_d0;
  undefined4 local_cc;
  void **local_c8;
  int local_b0;
  undefined4 local_ac;
  void **local_a8;
  int local_90;
  undefined4 local_8c;
  value_type *local_88;
  void *local_80;
  void *local_70;
  void *local_60;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int dilation_h;
  void **in_stack_ffffffffffffffc8;
  int activation_type;
  void **in_stack_ffffffffffffffd0;
  Mat *in_stack_ffffffffffffffd8;
  value_type *in_stack_ffffffffffffffe0;
  
  local_1e8 = in_RDX;
  local_1e0 = in_RSI;
  local_1f8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_200 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1e0,1);
  local_208 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1e8,0);
  local_20c = local_1f8->c;
  local_210 = local_200->w;
  local_214 = local_200->h;
  local_218 = local_200->d;
  local_1c8 = &local_260;
  local_260 = (void *)0x0;
  local_258 = (int *)0x0;
  local_250 = 0;
  local_248 = 0;
  local_240 = (long *)0x0;
  local_238 = 0;
  local_234 = 0;
  local_230 = 0;
  local_22c = 0;
  local_228 = 0;
  local_220 = 0;
  flatten(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,(Option *)in_stack_fffffffffffffb50);
  local_128 = &local_260;
  if (local_260 != (void *)0x0) {
    in_stack_ffffffffffffffc8 = local_128;
  }
  dilation_h = (int)in_stack_ffffffffffffffc8;
  local_3b9 = local_260 == (void *)0x0 || local_220 * local_228 == 0;
  if (local_3b9) {
    local_1cc = -100;
    local_270 = 1;
    goto LAB_00991304;
  }
  local_1c0 = &local_2b8;
  local_2b8 = (void *)0x0;
  local_2b0 = (int *)0x0;
  local_2a8 = 0;
  local_2a0 = 0;
  local_298 = (long *)0x0;
  local_290 = 0;
  local_28c = 0;
  local_288 = 0;
  local_284 = 0;
  local_280 = 0;
  local_278 = 0;
  Mat::create(in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
              CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
              (Allocator *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
  _c = (int)((ulong)in_stack_fffffffffffffb40 >> 0x20);
  local_130 = &local_2b8;
  if (local_2b8 != (void *)0x0) {
    in_stack_ffffffffffffffd0 = local_130;
  }
  activation_type = (int)in_stack_ffffffffffffffd0;
  local_3d9 = local_2b8 != (void *)0x0 && local_278 * local_280 != 0;
  if (local_3d9) {
    iVar2 = local_218 / 1;
    iVar3 = local_20c / 1;
    iVar4 = local_214 * local_210;
    for (local_2c8 = 0; local_2c8 < 1; local_2c8 = local_2c8 + 1) {
      local_120 = &local_2b8;
      local_118 = &local_260;
      for (in_stack_fffffffffffffd24 = 0; in_stack_fffffffffffffd24 < iVar2;
          in_stack_fffffffffffffd24 = in_stack_fffffffffffffd24 + 1) {
        for (in_stack_fffffffffffffd20 = 0; in_stack_fffffffffffffd20 < iVar3;
            in_stack_fffffffffffffd20 = in_stack_fffffffffffffd20 + 1) {
          for (in_stack_fffffffffffffd1c = 0; in_stack_fffffffffffffd1c < iVar4;
              in_stack_fffffffffffffd1c = in_stack_fffffffffffffd1c + 1) {
            *(undefined4 *)
             ((long)local_2b8 +
             (long)((in_stack_fffffffffffffd24 * iVar3 + in_stack_fffffffffffffd20) * iVar4 +
                   in_stack_fffffffffffffd1c) * 4 + (long)(local_2c8 * iVar2 * iVar3 * iVar4) * 4) =
                 *(undefined4 *)
                  ((long)local_260 +
                  (long)((in_stack_fffffffffffffd20 * iVar2 + in_stack_fffffffffffffd24) * iVar4 +
                        in_stack_fffffffffffffd1c) * 4 +
                  (long)(local_2c8 * iVar3 * iVar2 * iVar4) * 4);
          }
        }
      }
    }
    local_1b8 = &local_330;
    local_330 = (void *)0x0;
    local_328 = (int *)0x0;
    local_320 = 0;
    local_318 = 0;
    local_310 = (Allocator *)0x0;
    local_308 = 0;
    local_304 = 0;
    iVar2 = 0;
    iVar3 = 0;
    iVar4 = 0;
    weight_data = (Mat *)0x0;
    if (*(int *)(in_RDI + 0x10c) == 0) {
LAB_009905f1:
      local_33c = local_1f8->w;
      local_340 = local_1f8->h;
      local_344 = *(int *)(in_RDI + 0xdc) * (local_210 + -1) + 1;
      local_348 = *(int *)(in_RDI + 0xe0) * (local_214 + -1) + 1;
      local_34c = (local_33c + -1) * *(int *)(in_RDI + 0xe4) + local_344 + *(int *)(in_RDI + 0xfc);
      local_350 = (local_340 + -1) * *(int *)(in_RDI + 0xe8) + local_348 + *(int *)(in_RDI + 0x100);
      local_1b0 = &local_398;
      local_398.data = (void *)0x0;
      local_398.refcount = (int *)0x0;
      local_398.elemsize = 0;
      local_398.elempack = 0;
      local_398.allocator = (Allocator *)0x0;
      local_398.dims = 0;
      local_398.w = 0;
      local_398.h = 0;
      local_398.d = 0;
      local_398.c = 0;
      local_398.cstep = 0;
      iVar4 = (int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
      if ((((*(int *)(in_RDI + 0xec) < 1) && (*(int *)(in_RDI + 0xf0) < 1)) &&
          (*(int *)(in_RDI + 0xf4) < 1)) &&
         ((*(int *)(in_RDI + 0xf8) < 1 &&
          ((*(int *)(in_RDI + 0x104) < 1 || (*(int *)(in_RDI + 0x108) < 1)))))) {
        local_158 = &local_398;
        if (local_158 != local_208) {
          if (local_208->refcount != (int *)0x0) {
            piVar1 = local_208->refcount;
            local_164 = 1;
            LOCK();
            local_168 = *piVar1;
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          local_398.data = local_208->data;
          local_398.refcount = local_208->refcount;
          local_398.elemsize = local_208->elemsize;
          local_398.elempack = local_208->elempack;
          local_398.allocator = local_208->allocator;
          local_398.dims = local_208->dims;
          local_398.w = local_208->w;
          local_398.h = local_208->h;
          local_398.d = local_208->d;
          local_398.c = local_208->c;
          local_398.cstep = local_208->cstep;
          local_108 = local_158;
        }
        local_160 = local_208;
        local_150 = local_158;
        Mat::create(in_stack_fffffffffffffb50,iVar4,(int)in_stack_fffffffffffffb48,_c,
                    CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                    (Allocator *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      }
      else {
        Mat::create(in_stack_fffffffffffffb50,iVar4,(int)in_stack_fffffffffffffb48,_c,
                    CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                    (Allocator *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      }
      local_140 = &local_398;
      if (local_398.data != (void *)0x0) {
        in_stack_ffffffffffffffe0 = local_140;
      }
      local_441 = local_398.data != (void *)0x0 && local_398.cstep * (long)local_398.c != 0;
      if (local_441) {
        local_1cc = deconvolution((Mat *)CONCAT44(in_stack_fffffffffffffd24,
                                                  in_stack_fffffffffffffd20),
                                  (Mat *)CONCAT44(in_stack_fffffffffffffd1c,
                                                  in_stack_fffffffffffffd18),weight_data,
                                  in_stack_fffffffffffffd08,iVar3,iVar2,in_stack_ffffffffffffffb0,
                                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,dilation_h,
                                  activation_type,in_stack_ffffffffffffffd8,
                                  (Option *)in_stack_ffffffffffffffe0);
        if (local_1cc == 0) {
          cut_padding(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                      (Option *)in_stack_fffffffffffffb50);
          local_148 = local_208;
          bVar5 = true;
          if (local_208->data != (void *)0x0) {
            bVar5 = local_208->cstep * (long)local_208->c == 0;
          }
          if (bVar5) {
            local_1cc = -100;
          }
          else {
            local_1cc = 0;
          }
        }
      }
      else {
        local_1cc = -100;
      }
      local_270 = 1;
      local_1a8 = &local_398;
      local_88 = local_1a8;
      if (local_398.refcount != (int *)0x0) {
        local_8c = 0xffffffff;
        LOCK();
        local_90 = *local_398.refcount;
        *local_398.refcount = *local_398.refcount + -1;
        UNLOCK();
        if (local_90 == 1) {
          if (local_398.allocator == (Allocator *)0x0) {
            local_80 = local_398.data;
            if (local_398.data != (void *)0x0) {
              free(local_398.data);
            }
          }
          else {
            (*(local_398.allocator)->_vptr_Allocator[3])(local_398.allocator,local_398.data);
          }
        }
      }
      local_398.data = (void *)0x0;
      local_398.elemsize = 0;
      local_398.elempack = 0;
      local_398.dims = 0;
      local_398.w = 0;
      local_398.h = 0;
      local_398.d = 0;
      local_398.c = 0;
      local_398.cstep = 0;
      local_398.refcount = (int *)0x0;
    }
    else {
      local_338 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1e0,2);
      flatten(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
              (Option *)in_stack_fffffffffffffb50);
      local_138 = (Mat *)&local_330;
      if (local_330 != (void *)0x0) {
        in_stack_ffffffffffffffd8 = local_138;
      }
      if (local_330 != (void *)0x0 && (long)weight_data * (long)(int)in_stack_fffffffffffffd08 != 0)
      goto LAB_009905f1;
      local_1cc = -100;
      local_270 = 1;
    }
    local_198 = &local_330;
    local_a8 = local_198;
    if (local_328 != (int *)0x0) {
      local_ac = 0xffffffff;
      LOCK();
      local_b0 = *local_328;
      *local_328 = *local_328 + -1;
      UNLOCK();
      if (local_b0 == 1) {
        if (local_310 == (Allocator *)0x0) {
          local_70 = local_330;
          if (local_330 != (void *)0x0) {
            free(local_330);
          }
        }
        else {
          (*local_310->_vptr_Allocator[3])(local_310,local_330);
        }
      }
    }
    local_330 = (void *)0x0;
    local_320 = 0;
    local_318 = 0;
    local_308 = 0;
    local_304 = 0;
    local_328 = (int *)0x0;
  }
  else {
    local_1cc = -100;
    local_270 = 1;
  }
  local_188 = &local_2b8;
  local_c8 = local_188;
  if (local_2b0 != (int *)0x0) {
    local_cc = 0xffffffff;
    LOCK();
    local_d0 = *local_2b0;
    *local_2b0 = *local_2b0 + -1;
    UNLOCK();
    if (local_d0 == 1) {
      if (local_298 == (long *)0x0) {
        local_60 = local_2b8;
        if (local_2b8 != (void *)0x0) {
          free(local_2b8);
        }
      }
      else {
        (**(code **)(*local_298 + 0x18))(local_298,local_2b8);
      }
    }
  }
  local_2b8 = (void *)0x0;
  local_2a8 = 0;
  local_2a0 = 0;
  local_290 = 0;
  local_28c = 0;
  local_288 = 0;
  local_284 = 0;
  local_280 = 0;
  local_278 = 0;
  local_2b0 = (int *)0x0;
LAB_00991304:
  ppvVar6 = &local_260;
  if (local_258 != (int *)0x0) {
    local_ec = 0xffffffff;
    LOCK();
    local_f0 = *local_258;
    *local_258 = *local_258 + -1;
    UNLOCK();
    if (local_f0 == 1) {
      local_178 = ppvVar6;
      local_e8 = ppvVar6;
      if (local_240 == (long *)0x0) {
        if (local_260 != (void *)0x0) {
          free(local_260);
        }
      }
      else {
        (**(code **)(*local_240 + 0x18))(local_240,local_260);
      }
    }
  }
  *ppvVar6 = (void *)0x0;
  ppvVar6[2] = (void *)0x0;
  *(undefined4 *)(ppvVar6 + 3) = 0;
  *(undefined4 *)(ppvVar6 + 5) = 0;
  *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
  *(undefined4 *)(ppvVar6 + 6) = 0;
  *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
  *(undefined4 *)(ppvVar6 + 7) = 0;
  ppvVar6[8] = (void *)0x0;
  ppvVar6[1] = (void *)0x0;
  return local_1cc;
}

Assistant:

int Deconvolution::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * 1;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / 1, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / 1;
        const int inch_g = _num_input / 1;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < 1; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, _kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}